

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3_get_auxdata(sqlite3_context *pCtx,int iArg)

{
  VdbeFunc *pVVar1;
  void *pvVar2;
  
  pVVar1 = pCtx->pVdbeFunc;
  pvVar2 = (void *)0x0;
  if (((pVVar1 != (VdbeFunc *)0x0) && (-1 < iArg)) && (iArg < pVVar1->nAux)) {
    pvVar2 = pVVar1->apAux[(uint)iArg].pAux;
  }
  return pvVar2;
}

Assistant:

SQLITE_API void *sqlite3_get_auxdata(sqlite3_context *pCtx, int iArg){
  VdbeFunc *pVdbeFunc;

  assert( sqlite3_mutex_held(pCtx->s.db->mutex) );
  pVdbeFunc = pCtx->pVdbeFunc;
  if( !pVdbeFunc || iArg>=pVdbeFunc->nAux || iArg<0 ){
    return 0;
  }
  return pVdbeFunc->apAux[iArg].pAux;
}